

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_stats_table_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  __m256i alVar1;
  __m256i alVar2;
  uint uVar3;
  undefined4 uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  undefined1 auVar10 [32];
  __m256i alVar11;
  __m256i alVar12;
  __m256i c;
  __m256i c_00;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  uint uVar17;
  int iVar18;
  int iVar19;
  parasail_result_t *ppVar20;
  __m256i *palVar21;
  __m256i *ptr;
  __m256i *b;
  __m256i *ptr_00;
  __m256i *b_00;
  __m256i *ptr_01;
  __m256i *b_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *b_02;
  __m256i *b_03;
  __m256i *b_04;
  int64_t *ptr_04;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  longlong lVar26;
  undefined8 uVar27;
  int iVar28;
  ulong uVar29;
  long lVar30;
  __m256i *palVar31;
  longlong lVar32;
  int iVar33;
  int iVar34;
  __m256i *palVar35;
  long lVar36;
  ulong uVar37;
  longlong lVar38;
  uint uVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  int iVar43;
  long lVar44;
  long lVar45;
  ulong uVar46;
  uint uVar47;
  long lVar48;
  ulong size;
  long lVar49;
  long lVar50;
  uint uVar51;
  bool bVar52;
  undefined1 auVar54 [16];
  undefined1 auVar53 [16];
  undefined1 auVar59 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar66 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar81 [64];
  undefined1 in_ZMM7 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 in_stack_fffffffffffffcc8 [12];
  undefined4 in_stack_fffffffffffffcd4;
  int iVar91;
  int iVar92;
  __m256i *local_2f0;
  __m256i *local_2e8;
  __m256i *local_2b0;
  undefined1 local_248 [32];
  
  auVar69 = in_ZMM7._0_16_;
  auVar80 = in_ZMM6._0_32_;
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_table_striped_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar5 = (profile->profile64).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sg_flags_stats_table_striped_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_table_striped_profile_avx2_256_64_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sg_flags_stats_table_striped_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_table_striped_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_stats_table_striped_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_stats_table_striped_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_stats_table_striped_profile_avx2_256_64_cold_1();
        }
        else {
          uVar17 = uVar3 - 1;
          uVar46 = (ulong)uVar3 + 3;
          size = uVar46 >> 2;
          uVar9 = (ulong)uVar17 % size;
          iVar18 = (int)(uVar17 / size);
          pvVar7 = (profile->profile64).matches;
          pvVar8 = (profile->profile64).similar;
          uVar29 = CONCAT44(0,open);
          iVar43 = -open;
          iVar19 = ppVar6->min;
          uVar22 = 0x8000000000000000 - (long)iVar19;
          if (iVar19 != iVar43 && SBORROW4(iVar19,iVar43) == iVar19 + open < 0) {
            uVar22 = uVar29 | 0x8000000000000000;
          }
          iVar19 = ppVar6->max;
          ppVar20 = parasail_result_new_table3((uint)uVar46 & 0x7ffffffc,s2Len);
          if (ppVar20 != (parasail_result_t *)0x0) {
            ppVar20->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar20->flag | 0x4830802;
            palVar21 = parasail_memalign___m256i(0x20,size);
            ptr = parasail_memalign___m256i(0x20,size);
            b = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            b_00 = parasail_memalign___m256i(0x20,size);
            ptr_01 = parasail_memalign___m256i(0x20,size);
            b_01 = parasail_memalign___m256i(0x20,size);
            ptr_02 = parasail_memalign___m256i(0x20,size);
            ptr_03 = parasail_memalign___m256i(0x20,size);
            b_02 = parasail_memalign___m256i(0x20,size);
            b_03 = parasail_memalign___m256i(0x20,size);
            b_04 = parasail_memalign___m256i(0x20,size);
            ptr_04 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
            auVar61._8_8_ = 0;
            auVar61._0_8_ = palVar21;
            auVar66._8_8_ = 0;
            auVar66._0_8_ = ptr;
            auVar61 = vpunpcklqdq_avx(auVar61,auVar66);
            auVar53._8_8_ = 0;
            auVar53._0_8_ = b;
            auVar59._8_8_ = 0;
            auVar59._0_8_ = ptr_00;
            auVar66 = vpunpcklqdq_avx(auVar53,auVar59);
            auVar53 = ZEXT116(0) * auVar66 + ZEXT116(1) * auVar61;
            auVar59 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar66;
            auVar60._8_8_ = 0;
            auVar60._0_8_ = b_00;
            auVar67._8_8_ = 0;
            auVar67._0_8_ = ptr_01;
            auVar61 = vpunpcklqdq_avx(auVar60,auVar67);
            auVar68._8_8_ = 0;
            auVar68._0_8_ = b_01;
            auVar70._8_8_ = 0;
            auVar70._0_8_ = ptr_02;
            auVar66 = vpunpcklqdq_avx(auVar68,auVar70);
            auVar61 = ZEXT116(0) * auVar66 + ZEXT116(1) * auVar61;
            auVar66 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar66;
            auVar55._0_8_ = -(ulong)(auVar53._0_8_ == 0);
            auVar55._8_8_ = -(ulong)(auVar53._8_8_ == 0);
            auVar55._16_8_ = -(ulong)(auVar59._0_8_ == 0);
            auVar55._24_8_ = -(ulong)(auVar59._8_8_ == 0);
            auVar63._0_8_ = -(ulong)(auVar61._0_8_ == 0);
            auVar63._8_8_ = -(ulong)(auVar61._8_8_ == 0);
            auVar63._16_8_ = -(ulong)(auVar66._0_8_ == 0);
            auVar63._24_8_ = -(ulong)(auVar66._8_8_ == 0);
            auVar55 = vpackssdw_avx2(auVar55,auVar63);
            if (((((b_02 != (__m256i *)0x0 && ptr_03 != (__m256i *)0x0) && b_03 != (__m256i *)0x0)
                 && b_04 != (__m256i *)0x0) && ptr_04 != (int64_t *)0x0) &&
                ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar55 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar55 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar55 >> 0x7f,0) == '\0') &&
                   (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar55 >> 0xbf,0) == '\0') &&
                 (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar55[0x1f])) {
              iVar92 = s2Len + -1;
              iVar28 = -iVar18;
              iVar33 = iVar28 + 3;
              auVar56._8_4_ = gap;
              auVar56._0_8_ = CONCAT44(0,gap);
              auVar56._12_4_ = 0;
              auVar56._16_4_ = gap;
              auVar56._20_4_ = 0;
              auVar56._24_4_ = gap;
              auVar56._28_4_ = 0;
              lVar30 = uVar22 + 1;
              lVar40 = 0x7ffffffffffffffe - (long)iVar19;
              bVar52 = s1_beg != 0;
              alVar11[1]._4_4_ = in_stack_fffffffffffffcd4;
              alVar11._0_12_ = in_stack_fffffffffffffcc8;
              alVar11[2] = lVar30;
              alVar11[3]._0_4_ = iVar92;
              alVar11[3]._4_4_ = iVar18;
              lVar48 = lVar30;
              parasail_memset___m256i(b,alVar11,size);
              alVar12[1]._4_4_ = in_stack_fffffffffffffcd4;
              alVar12._0_12_ = in_stack_fffffffffffffcc8;
              alVar12[2] = lVar48;
              alVar12[3]._0_4_ = iVar92;
              alVar12[3]._4_4_ = iVar18;
              parasail_memset___m256i(b_00,alVar12,size);
              alVar1[1]._4_4_ = in_stack_fffffffffffffcd4;
              alVar1._0_12_ = in_stack_fffffffffffffcc8;
              alVar1[2] = lVar48;
              alVar1[3]._0_4_ = iVar92;
              alVar1[3]._4_4_ = iVar18;
              parasail_memset___m256i(b_01,alVar1,size);
              alVar2[1]._4_4_ = in_stack_fffffffffffffcd4;
              alVar2._0_12_ = in_stack_fffffffffffffcc8;
              alVar2[2] = lVar48;
              alVar2[3]._0_4_ = iVar92;
              alVar2[3]._4_4_ = iVar18;
              parasail_memset___m256i(b_02,alVar2,size);
              c[1]._4_4_ = in_stack_fffffffffffffcd4;
              c._0_12_ = in_stack_fffffffffffffcc8;
              c[2] = lVar48;
              c[3]._0_4_ = iVar92;
              c[3]._4_4_ = iVar18;
              parasail_memset___m256i(b_03,c,size);
              c_00[1]._4_4_ = in_stack_fffffffffffffcd4;
              c_00._0_12_ = in_stack_fffffffffffffcc8;
              c_00[2] = lVar48;
              c_00[3]._0_4_ = iVar92;
              c_00[3]._4_4_ = iVar18;
              parasail_memset___m256i(b_04,c_00,size);
              auVar85._8_4_ = open;
              auVar85._0_8_ = uVar29;
              auVar85._12_4_ = 0;
              auVar85._16_4_ = open;
              auVar85._20_4_ = 0;
              auVar85._24_4_ = open;
              auVar85._28_4_ = 0;
              uVar22 = (ulong)iVar43;
              uVar51 = (uint)size;
              auVar74._4_4_ = uVar51;
              auVar74._0_4_ = uVar51;
              auVar74._8_4_ = uVar51;
              auVar74._12_4_ = uVar51;
              auVar74._16_4_ = uVar51;
              auVar74._20_4_ = uVar51;
              auVar74._24_4_ = uVar51;
              auVar74._28_4_ = uVar51;
              auVar57._8_4_ = gap;
              auVar57._0_8_ = CONCAT44(0,gap);
              auVar57._12_4_ = 0;
              auVar57._16_4_ = gap;
              auVar57._20_4_ = 0;
              auVar57._24_4_ = gap;
              auVar57._28_4_ = 0;
              auVar64._8_8_ = uVar22;
              auVar64._0_8_ = uVar22;
              auVar64._16_8_ = uVar22;
              auVar64._24_8_ = uVar22;
              auVar63 = vpmuldq_avx2(auVar74,_DAT_00908b60);
              auVar71[1] = bVar52;
              auVar71[0] = bVar52;
              auVar71[2] = bVar52;
              auVar71[3] = bVar52;
              auVar71[4] = bVar52;
              auVar71[5] = bVar52;
              auVar71[6] = bVar52;
              auVar71[7] = bVar52;
              auVar71[8] = bVar52;
              auVar71[9] = bVar52;
              auVar71[10] = bVar52;
              auVar71[0xb] = bVar52;
              auVar71[0xc] = bVar52;
              auVar71[0xd] = bVar52;
              auVar71[0xe] = bVar52;
              auVar71[0xf] = bVar52;
              uVar23 = 0;
              auVar61 = vpslld_avx(auVar71,0x1f);
              auVar61 = vpsrad_avx(auVar61,0x1f);
              auVar55 = vpmovsxdq_avx2(auVar61);
              palVar31 = palVar21;
              palVar35 = ptr_03;
              do {
                auVar73._8_8_ = uVar23;
                auVar73._0_8_ = uVar23;
                auVar73._16_8_ = uVar23;
                auVar73._24_8_ = uVar23;
                auVar74 = vpaddq_avx2(auVar63,auVar73);
                auVar73 = vpmuludq_avx2(auVar74,auVar57);
                auVar74 = vpsrlq_avx2(auVar74,0x20);
                auVar74 = vpmuludq_avx2(auVar74,auVar57);
                auVar74 = vpsllq_avx2(auVar74,0x20);
                auVar74 = vpaddq_avx2(auVar73,auVar74);
                auVar74 = vpsubq_avx2(auVar64,auVar74);
                alVar11 = (__m256i)vpandn_avx2(auVar55,auVar74);
                alVar12 = (__m256i)vpsubq_avx2((undefined1  [32])alVar11,auVar85);
                *palVar31 = alVar11;
                *palVar35 = alVar12;
                uVar23 = uVar23 + 1;
                palVar35 = palVar35 + 1;
                palVar31 = palVar31 + 1;
              } while (size != uVar23);
              *ptr_04 = 0;
              uVar23 = (ulong)(uint)s2Len;
              lVar24 = uVar23 - 1;
              auVar77._8_8_ = lVar24;
              auVar77._0_8_ = lVar24;
              auVar77._16_8_ = lVar24;
              auVar77._24_8_ = lVar24;
              auVar54._4_4_ = gap;
              auVar54._0_4_ = gap;
              auVar54._8_4_ = gap;
              auVar54._12_4_ = gap;
              auVar62._4_4_ = iVar43;
              auVar62._0_4_ = iVar43;
              auVar62._8_4_ = iVar43;
              auVar62._12_4_ = iVar43;
              auVar61 = vpmovsxbd_avx(ZEXT416(0x4030201));
              uVar25 = 0;
              auVar55 = vpmovsxbq_avx2(ZEXT416(0x3020100));
              auVar75._8_8_ = 0x8000000000000000;
              auVar75._0_8_ = 0x8000000000000000;
              auVar75._16_8_ = 0x8000000000000000;
              auVar75._24_8_ = 0x8000000000000000;
              auVar80 = vpcmpeqd_avx2(auVar80,auVar80);
              auVar69 = vpcmpeqd_avx(auVar69,auVar69);
              auVar83._8_4_ = 4;
              auVar83._0_8_ = 0x400000004;
              auVar83._12_4_ = 4;
              do {
                if (s2_beg == 0) {
                  auVar66 = vpaddd_avx(auVar61,auVar69);
                  auVar66 = vpmulld_avx(auVar66,auVar54);
                  auVar66 = vpsubd_avx(auVar62,auVar66);
                  auVar63 = vpmovsxdq_avx2(auVar66);
                }
                else {
                  auVar63 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                }
                auVar88._8_8_ = uVar25;
                auVar88._0_8_ = uVar25;
                auVar88._16_8_ = uVar25;
                auVar88._24_8_ = uVar25;
                auVar85 = vpor_avx2(auVar88,auVar55);
                auVar85 = vpcmpgtq_avx2(auVar85 ^ auVar75,auVar77 ^ auVar75);
                auVar63 = vpmaskmovq_avx2(auVar85 ^ auVar80,auVar63);
                *(undefined1 (*) [32])(ptr_04 + uVar25 + 1) = auVar63;
                uVar25 = uVar25 + 4;
                auVar61 = vpaddd_avx(auVar83,auVar61);
              } while ((s2Len + 3U & 0xfffffffc) != uVar25);
              uVar39 = uVar51 - 1;
              lVar44 = size * uVar23;
              lVar24 = lVar44 * 4;
              lVar45 = lVar44 * 8;
              lVar44 = lVar44 * 0xc;
              lVar41 = 0;
              uVar25 = 0;
              auVar80._8_8_ = lVar30;
              auVar80._0_8_ = lVar30;
              auVar80._16_8_ = lVar30;
              auVar80._24_8_ = lVar30;
              auVar72 = ZEXT3264(auVar80);
              auVar76 = ZEXT3264(auVar80);
              auVar79 = ZEXT3264(auVar80);
              auVar82 = ZEXT3264(auVar80);
              auVar81 = ZEXT3264(auVar80);
              auVar58 = ZEXT3264(CONCAT824(lVar40,CONCAT816(lVar40,CONCAT88(lVar40,lVar40))));
              iVar19 = iVar92;
              do {
                local_2b0 = ptr_02;
                local_2e8 = ptr_00;
                local_2f0 = ptr_01;
                palVar31 = ptr;
                ptr_02 = b_01;
                ptr_01 = b_00;
                ptr_00 = b;
                ptr = palVar21;
                local_248 = auVar81._0_32_;
                alVar11 = ptr_00[uVar39];
                alVar12 = ptr_01[uVar39];
                alVar1 = ptr_02[uVar39];
                auVar69 = SUB3216(ptr[uVar39],0);
                auVar84._0_16_ = ZEXT116(0) * auVar69 + ZEXT116(1) * auVar58._0_16_;
                auVar84._16_16_ = ZEXT116(0) * auVar58._16_16_ + ZEXT116(1) * auVar69;
                auVar80 = vpalignr_avx2((undefined1  [32])ptr[uVar39],auVar84,8);
                auVar55 = vperm2i128_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar11,8);
                auVar55 = vpalignr_avx2((undefined1  [32])alVar11,auVar55,8);
                auVar63 = vperm2i128_avx2((undefined1  [32])alVar12,(undefined1  [32])alVar12,8);
                auVar63 = vpalignr_avx2((undefined1  [32])alVar12,auVar63,8);
                auVar85 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8);
                auVar85 = vpalignr_avx2((undefined1  [32])alVar1,auVar85,8);
                auVar80 = vpblendd_avx2(auVar80,ZEXT832((ulong)ptr_04[uVar25]),3);
                lVar42 = (long)ppVar6->mapper[(byte)s2[uVar25]] * size * 0x20;
                auVar86 = ZEXT1664((undefined1  [16])0x0);
                lVar49 = 0;
                auVar90 = ZEXT3264(CONCAT824(1,CONCAT816(1,CONCAT88(1,1))));
                auVar87 = ZEXT1664((undefined1  [16])0x0);
                auVar89 = ZEXT3264(CONCAT824(lVar30,CONCAT816(lVar30,CONCAT88(lVar30,lVar30))));
                lVar36 = lVar41;
                do {
                  auVar57 = *(undefined1 (*) [32])((long)*ptr_03 + lVar49);
                  auVar64 = *(undefined1 (*) [32])((long)*b_02 + lVar49);
                  auVar74 = *(undefined1 (*) [32])((long)*b_03 + lVar49);
                  auVar73 = *(undefined1 (*) [32])((long)*b_04 + lVar49);
                  auVar75 = vpaddq_avx2(auVar80,*(undefined1 (*) [32])
                                                 ((long)pvVar5 + lVar49 + lVar42));
                  auVar80 = vpcmpgtq_avx2(auVar75,auVar57);
                  auVar80 = vblendvpd_avx(auVar57,auVar75,auVar80);
                  auVar84 = auVar89._0_32_;
                  auVar77 = vpcmpgtq_avx2(auVar80,auVar84);
                  auVar80 = vblendvpd_avx(auVar84,auVar80,auVar77);
                  *(undefined1 (*) [32])((long)*palVar31 + lVar49) = auVar80;
                  auVar78._0_8_ = -(ulong)(auVar80._0_8_ == auVar75._0_8_);
                  auVar78._8_8_ = -(ulong)(auVar80._8_8_ == auVar75._8_8_);
                  auVar78._16_8_ = -(ulong)(auVar80._16_8_ == auVar75._16_8_);
                  auVar78._24_8_ = -(ulong)(auVar80._24_8_ == auVar75._24_8_);
                  auVar75 = vblendvpd_avx(auVar87._0_32_,auVar64,auVar77);
                  auVar55 = vpaddq_avx2(auVar55,*(undefined1 (*) [32])
                                                 ((long)pvVar7 + lVar49 + lVar42));
                  auVar55 = vblendvpd_avx(auVar75,auVar55,auVar78);
                  *(undefined1 (*) [32])((long)*local_2e8 + lVar49) = auVar55;
                  auVar75 = vblendvpd_avx(auVar86._0_32_,auVar74,auVar77);
                  auVar63 = vpaddq_avx2(auVar63,*(undefined1 (*) [32])
                                                 ((long)pvVar8 + lVar49 + lVar42));
                  auVar63 = vblendvpd_avx(auVar75,auVar63,auVar78);
                  auVar75 = vblendvpd_avx(auVar90._0_32_,auVar73,auVar77);
                  auVar77 = vpcmpeqd_avx2(auVar73,auVar73);
                  auVar85 = vpsubq_avx2(auVar85,auVar77);
                  auVar85 = vblendvpd_avx(auVar75,auVar85,auVar78);
                  *(undefined1 (*) [32])((long)*local_2f0 + lVar49) = auVar63;
                  *(undefined1 (*) [32])((long)*local_2b0 + lVar49) = auVar85;
                  lVar50 = *(long *)((long)((ppVar20->field_4).trace)->trace_del_table + 8);
                  *(int *)(lVar50 + lVar36) = auVar55._0_4_;
                  lVar50 = lVar50 + lVar36;
                  uVar4 = vextractps_avx(auVar55._0_16_,2);
                  *(undefined4 *)(lVar24 + lVar50) = uVar4;
                  *(int *)(lVar45 + lVar50) = auVar55._16_4_;
                  uVar4 = vextractps_avx(auVar55._16_16_,2);
                  *(undefined4 *)(lVar44 + lVar50) = uVar4;
                  lVar50 = *(long *)((long)((ppVar20->field_4).trace)->trace_del_table + 0x10);
                  *(int *)(lVar50 + lVar36) = auVar63._0_4_;
                  lVar50 = lVar50 + lVar36;
                  uVar4 = vextractps_avx(auVar63._0_16_,2);
                  *(undefined4 *)(lVar24 + lVar50) = uVar4;
                  *(int *)(lVar45 + lVar50) = auVar63._16_4_;
                  uVar4 = vextractps_avx(auVar63._16_16_,2);
                  *(undefined4 *)(lVar44 + lVar50) = uVar4;
                  lVar50 = *(long *)((long)((ppVar20->field_4).trace)->trace_del_table + 0x18);
                  *(int *)(lVar50 + lVar36) = auVar85._0_4_;
                  lVar50 = lVar50 + lVar36;
                  uVar4 = vextractps_avx(auVar85._0_16_,2);
                  *(undefined4 *)(lVar24 + lVar50) = uVar4;
                  *(int *)(lVar45 + lVar50) = auVar85._16_4_;
                  uVar4 = vextractps_avx(auVar85._16_16_,2);
                  *(undefined4 *)(lVar44 + lVar50) = uVar4;
                  lVar50 = *((ppVar20->field_4).trace)->trace_del_table;
                  *(int *)(lVar50 + lVar36) = auVar80._0_4_;
                  lVar50 = lVar50 + lVar36;
                  *(int *)(lVar24 + lVar50) = auVar80._8_4_;
                  *(int *)(lVar45 + lVar50) = auVar80._16_4_;
                  uVar4 = vextractps_avx(auVar80._16_16_,2);
                  *(undefined4 *)(lVar44 + lVar50) = uVar4;
                  auVar75 = vpcmpgtq_avx2(auVar80,auVar58._0_32_);
                  auVar75 = vblendvpd_avx(auVar80,auVar58._0_32_,auVar75);
                  auVar58 = ZEXT3264(auVar75);
                  auVar75 = vpcmpgtq_avx2(local_248,auVar80);
                  auVar75 = vblendvpd_avx(auVar80,local_248,auVar75);
                  auVar88 = vpcmpgtq_avx2(auVar75,auVar55);
                  auVar75 = vblendvpd_avx(auVar55,auVar75,auVar88);
                  auVar88 = vpcmpgtq_avx2(auVar75,auVar63);
                  auVar75 = vblendvpd_avx(auVar63,auVar75,auVar88);
                  auVar88 = vpcmpgtq_avx2(auVar75,auVar85);
                  local_248 = vblendvpd_avx(auVar85,auVar75,auVar88);
                  auVar14._8_4_ = open;
                  auVar14._0_8_ = uVar29;
                  auVar14._12_4_ = 0;
                  auVar14._16_4_ = open;
                  auVar14._20_4_ = 0;
                  auVar14._24_4_ = open;
                  auVar14._28_4_ = 0;
                  auVar88 = vpsubq_avx2(auVar80,auVar14);
                  auVar80 = vpsubq_avx2(auVar57,auVar56);
                  auVar75 = vpcmpgtq_avx2(auVar88,auVar80);
                  auVar80 = vblendvpd_avx(auVar80,auVar88,auVar75);
                  auVar57 = vblendvpd_avx(auVar64,auVar55,auVar75);
                  auVar64 = vblendvpd_avx(auVar74,auVar63,auVar75);
                  auVar74 = vpsubq_avx2(auVar73,auVar77);
                  auVar73 = vpsubq_avx2(auVar85,auVar77);
                  auVar85 = vblendvpd_avx(auVar74,auVar73,auVar75);
                  *(undefined1 (*) [32])((long)*ptr_03 + lVar49) = auVar80;
                  *(undefined1 (*) [32])((long)*b_02 + lVar49) = auVar57;
                  *(undefined1 (*) [32])((long)*b_03 + lVar49) = auVar64;
                  *(undefined1 (*) [32])((long)*b_04 + lVar49) = auVar85;
                  auVar80 = vpsubq_avx2(auVar84,auVar56);
                  auVar85 = vpcmpgtq_avx2(auVar88,auVar80);
                  auVar80 = vblendvpd_avx(auVar80,auVar88,auVar85);
                  auVar89 = ZEXT3264(auVar80);
                  auVar80 = vblendvpd_avx(auVar87._0_32_,auVar55,auVar85);
                  auVar87 = ZEXT3264(auVar80);
                  auVar80 = vblendvpd_avx(auVar86._0_32_,auVar63,auVar85);
                  auVar86 = ZEXT3264(auVar80);
                  auVar80 = vpsubq_avx2(auVar90._0_32_,auVar77);
                  auVar80 = vblendvpd_avx(auVar80,auVar73,auVar85);
                  auVar90 = ZEXT3264(auVar80);
                  auVar80 = *(undefined1 (*) [32])((long)*ptr + lVar49);
                  auVar55 = *(undefined1 (*) [32])((long)*ptr_00 + lVar49);
                  auVar63 = *(undefined1 (*) [32])((long)*ptr_01 + lVar49);
                  auVar85 = *(undefined1 (*) [32])((long)*ptr_02 + lVar49);
                  lVar49 = lVar49 + 0x20;
                  lVar36 = lVar36 + uVar23 * 4;
                } while (size << 5 != lVar49);
                iVar43 = 0;
                auVar81 = ZEXT3264(local_248);
                auVar15._8_4_ = open;
                auVar15._0_8_ = uVar29;
                auVar15._12_4_ = 0;
                auVar15._16_4_ = open;
                auVar15._20_4_ = 0;
                auVar15._24_4_ = open;
                auVar15._28_4_ = 0;
                auVar80 = vpcmpeqd_avx2(auVar56,auVar56);
                do {
                  uVar37 = uVar22;
                  if (s2_beg == 0) {
                    uVar37 = ptr_04[uVar25 + 1] - uVar29;
                  }
                  auVar57 = vpermq_avx2((undefined1  [32])ptr[uVar39],0x90);
                  auVar63 = vpermpd_avx2(auVar89._0_32_,0x90);
                  auVar85 = auVar87._0_32_;
                  auVar55 = vperm2f128_avx(auVar85,auVar85,8);
                  auVar55 = vpalignr_avx2(auVar85,auVar55,8);
                  auVar87 = ZEXT3264(auVar55);
                  auVar85 = auVar86._0_32_;
                  auVar55 = vperm2f128_avx(auVar85,auVar85,8);
                  auVar55 = vpalignr_avx2(auVar85,auVar55,8);
                  auVar86 = ZEXT3264(auVar55);
                  auVar85 = vpermpd_avx2(auVar90._0_32_,0x90);
                  auVar55 = vpblendd_avx2(auVar57,ZEXT832((ulong)ptr_04[uVar25]),3);
                  auVar63 = vblendpd_avx(auVar63,ZEXT832(uVar37),1);
                  auVar89 = ZEXT3264(auVar63);
                  auVar63 = vblendpd_avx(auVar85,SUB6432(ZEXT864(1),0),1);
                  auVar90 = ZEXT3264(auVar63);
                  lVar49 = 0;
                  lVar36 = lVar41;
                  do {
                    auVar63 = vpaddq_avx2(auVar55,*(undefined1 (*) [32])
                                                   ((long)pvVar5 + lVar49 + lVar42));
                    auVar55 = *(undefined1 (*) [32])((long)*palVar31 + lVar49);
                    auVar75 = auVar89._0_32_;
                    auVar85 = vpcmpgtq_avx2(auVar55,auVar75);
                    auVar55 = vblendvpd_avx(auVar75,auVar55,auVar85);
                    *(undefined1 (*) [32])((long)*palVar31 + lVar49) = auVar55;
                    auVar65._0_8_ = -(ulong)(auVar55._0_8_ == auVar63._0_8_);
                    auVar65._8_8_ = -(ulong)(auVar55._8_8_ == auVar63._8_8_);
                    auVar65._16_8_ = -(ulong)(auVar55._16_8_ == auVar63._16_8_);
                    auVar65._24_8_ = -(ulong)(auVar55._24_8_ == auVar63._24_8_);
                    auVar57 = vpor_avx2(auVar65,auVar85);
                    auVar63 = vblendvpd_avx(auVar87._0_32_,
                                            *(undefined1 (*) [32])((long)*local_2e8 + lVar49),
                                            auVar57);
                    *(undefined1 (*) [32])((long)*local_2e8 + lVar49) = auVar63;
                    auVar85 = vblendvpd_avx(auVar86._0_32_,
                                            *(undefined1 (*) [32])((long)*local_2f0 + lVar49),
                                            auVar57);
                    *(undefined1 (*) [32])((long)*local_2f0 + lVar49) = auVar85;
                    auVar57 = vblendvpd_avx(auVar90._0_32_,
                                            *(undefined1 (*) [32])((long)*local_2b0 + lVar49),
                                            auVar57);
                    *(undefined1 (*) [32])((long)*local_2b0 + lVar49) = auVar57;
                    auVar64 = vpcmpgtq_avx2(auVar55,auVar58._0_32_);
                    auVar64 = vblendvpd_avx(auVar55,auVar58._0_32_,auVar64);
                    auVar58 = ZEXT3264(auVar64);
                    auVar74 = vpcmpgtq_avx2(auVar81._0_32_,auVar55);
                    auVar74 = vblendvpd_avx(auVar55,auVar81._0_32_,auVar74);
                    auVar73 = vpcmpgtq_avx2(auVar74,auVar63);
                    auVar74 = vblendvpd_avx(auVar63,auVar74,auVar73);
                    auVar73 = vpcmpgtq_avx2(auVar74,auVar85);
                    auVar74 = vblendvpd_avx(auVar85,auVar74,auVar73);
                    auVar73 = vpcmpgtq_avx2(auVar74,auVar57);
                    auVar74 = vblendvpd_avx(auVar57,auVar74,auVar73);
                    auVar81 = ZEXT3264(auVar74);
                    lVar50 = *(long *)((long)((ppVar20->field_4).trace)->trace_del_table + 8);
                    *(int *)(lVar50 + lVar36) = auVar63._0_4_;
                    lVar50 = lVar50 + lVar36;
                    *(int *)(lVar24 + lVar50) = auVar63._8_4_;
                    *(int *)(lVar45 + lVar50) = auVar63._16_4_;
                    uVar4 = vextractps_avx(auVar63._16_16_,2);
                    *(undefined4 *)(lVar44 + lVar50) = uVar4;
                    lVar50 = *(long *)((long)((ppVar20->field_4).trace)->trace_del_table + 0x10);
                    *(int *)(lVar50 + lVar36) = auVar85._0_4_;
                    lVar50 = lVar50 + lVar36;
                    *(int *)(lVar24 + lVar50) = auVar85._8_4_;
                    *(int *)(lVar45 + lVar50) = auVar85._16_4_;
                    uVar4 = vextractps_avx(auVar85._16_16_,2);
                    *(undefined4 *)(lVar44 + lVar50) = uVar4;
                    lVar50 = *(long *)((long)((ppVar20->field_4).trace)->trace_del_table + 0x18);
                    *(int *)(lVar50 + lVar36) = auVar57._0_4_;
                    lVar50 = lVar50 + lVar36;
                    *(int *)(lVar24 + lVar50) = auVar57._8_4_;
                    *(int *)(lVar45 + lVar50) = auVar57._16_4_;
                    uVar4 = vextractps_avx(auVar57._16_16_,2);
                    *(undefined4 *)(lVar44 + lVar50) = uVar4;
                    lVar50 = *((ppVar20->field_4).trace)->trace_del_table;
                    *(int *)(lVar50 + lVar36) = auVar55._0_4_;
                    lVar50 = lVar50 + lVar36;
                    *(int *)(lVar24 + lVar50) = auVar55._8_4_;
                    *(int *)(lVar45 + lVar50) = auVar55._16_4_;
                    uVar4 = vextractps_avx(auVar55._16_16_,2);
                    *(undefined4 *)(lVar44 + lVar50) = uVar4;
                    auVar55 = vpsubq_avx2(auVar55,auVar15);
                    auVar73 = vpsubq_avx2(auVar75,auVar56);
                    auVar89 = ZEXT3264(auVar73);
                    auVar73 = vpcmpgtq_avx2(auVar55,auVar73);
                    auVar55 = auVar80 & ~auVar73;
                    if ((((auVar55 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         SUB321(auVar55 >> 0x7f,0) == '\0') && SUB321(auVar55 >> 0xbf,0) == '\0') &&
                        -1 < auVar55[0x1f]) goto LAB_007f1a59;
                    auVar55 = vblendvpd_avx(auVar87._0_32_,auVar63,auVar73);
                    auVar87 = ZEXT3264(auVar55);
                    auVar55 = vblendvpd_avx(auVar86._0_32_,auVar85,auVar73);
                    auVar86 = ZEXT3264(auVar55);
                    auVar55 = vblendvpd_avx(auVar90._0_32_,auVar57,auVar73);
                    auVar55 = vpsubq_avx2(auVar55,auVar80);
                    auVar90 = ZEXT3264(auVar55);
                    auVar55 = *(undefined1 (*) [32])((long)*ptr + lVar49);
                    lVar49 = lVar49 + 0x20;
                    lVar36 = lVar36 + uVar23 * 4;
                  } while (size << 5 != lVar49);
                  iVar43 = iVar43 + 1;
                } while (iVar43 != 4);
LAB_007f1a59:
                auVar55 = vpcmpgtq_avx2((undefined1  [32])palVar31[uVar9],auVar82._0_32_);
                auVar80 = vblendvpd_avx(auVar82._0_32_,(undefined1  [32])palVar31[uVar9],auVar55);
                auVar69 = auVar80._16_16_;
                auVar82 = ZEXT3264(auVar80);
                auVar80 = vblendvpd_avx(auVar79._0_32_,(undefined1  [32])local_2e8[uVar9],auVar55);
                auVar61 = auVar80._16_16_;
                auVar79 = ZEXT3264(auVar80);
                auVar80 = vblendvpd_avx(auVar76._0_32_,(undefined1  [32])local_2f0[uVar9],auVar55);
                auVar66 = auVar80._16_16_;
                auVar76 = ZEXT3264(auVar80);
                auVar80 = vblendvpd_avx(auVar72._0_32_,(undefined1  [32])local_2b0[uVar9],auVar55);
                auVar53 = auVar80._16_16_;
                auVar72 = ZEXT3264(auVar80);
                auVar10._8_8_ = -(ulong)(iVar33 == 2);
                auVar10._0_8_ = -(ulong)(iVar33 == 3);
                auVar10._16_8_ = -(ulong)(iVar33 == 1);
                auVar10._24_8_ = -(ulong)(iVar28 == -3);
                auVar10 = auVar10 & auVar55;
                if ((((auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar10 >> 0x7f,0) != '\0') || SUB321(auVar10 >> 0xbf,0) != '\0') ||
                    auVar10[0x1f] < '\0') {
                  iVar19 = (int)uVar25;
                }
                uVar25 = uVar25 + 1;
                lVar41 = lVar41 + 4;
                palVar21 = palVar31;
                b = local_2e8;
                b_00 = local_2f0;
                b_01 = local_2b0;
                if (uVar25 == uVar23) {
                  if (s2_end == 0) {
                    lVar26 = 0;
                    lVar32 = 0;
                    lVar38 = 0;
                  }
                  else {
                    if (iVar18 < 3) {
                      iVar43 = 0;
                      do {
                        auVar55 = auVar82._0_32_;
                        auVar80 = vperm2f128_avx(auVar55,auVar55,8);
                        auVar80 = vpalignr_avx2(auVar55,auVar80,8);
                        auVar69 = auVar80._16_16_;
                        auVar82 = ZEXT3264(auVar80);
                        auVar55 = auVar79._0_32_;
                        auVar80 = vperm2f128_avx(auVar55,auVar55,8);
                        auVar80 = vpalignr_avx2(auVar55,auVar80,8);
                        auVar61 = auVar80._16_16_;
                        auVar79 = ZEXT3264(auVar80);
                        auVar55 = auVar76._0_32_;
                        auVar80 = vperm2f128_avx(auVar55,auVar55,8);
                        auVar80 = vpalignr_avx2(auVar55,auVar80,8);
                        auVar66 = auVar80._16_16_;
                        auVar76 = ZEXT3264(auVar80);
                        auVar55 = auVar72._0_32_;
                        auVar80 = vperm2f128_avx(auVar55,auVar55,8);
                        auVar80 = vpalignr_avx2(auVar55,auVar80,8);
                        auVar53 = auVar80._16_16_;
                        auVar72 = ZEXT3264(auVar80);
                        iVar43 = iVar43 + 1;
                      } while (iVar43 < iVar33);
                    }
                    lVar48 = vpextrq_avx(auVar69,1);
                    lVar26 = vpextrq_avx(auVar61,1);
                    lVar32 = vpextrq_avx(auVar66,1);
                    lVar38 = vpextrq_avx(auVar53,1);
                  }
                  iVar34 = (int)lVar38;
                  iVar28 = (int)lVar32;
                  iVar43 = (int)lVar26;
                  uVar39 = uVar17;
                  if ((s1_end != 0) && ((uVar46 & 0x7ffffffc) != 0)) {
                    uVar46 = 0;
                    lVar24 = lVar48;
                    do {
                      uVar47 = ((uint)uVar46 & 3) * uVar51 + ((uint)(uVar46 >> 2) & 0x3fffffff);
                      lVar48 = lVar24;
                      if ((int)uVar47 < (int)uVar3) {
                        lVar44 = (*palVar31)[uVar46];
                        lVar48 = lVar44;
                        if ((lVar24 < lVar44) ||
                           (((lVar48 = lVar24, lVar44 == lVar24 && (iVar19 == iVar92)) &&
                            ((int)uVar47 < (int)uVar39)))) {
                          lVar26 = (*local_2e8)[uVar46];
                          lVar32 = (*local_2f0)[uVar46];
                          lVar38 = (*local_2b0)[uVar46];
                          iVar19 = iVar92;
                          uVar39 = uVar47;
                        }
                      }
                      iVar34 = (int)lVar38;
                      iVar28 = (int)lVar32;
                      iVar43 = (int)lVar26;
                      uVar46 = uVar46 + 1;
                      lVar24 = lVar48;
                    } while ((uVar51 & 0x1fffffff) << 2 != (int)uVar46);
                  }
                  iVar91 = (int)lVar48;
                  if (s2_end == 0 && s1_end == 0) {
                    alVar11 = palVar31[uVar9];
                    auVar69 = alVar11._16_16_;
                    alVar12 = local_2e8[uVar9];
                    auVar61 = alVar12._16_16_;
                    alVar1 = local_2f0[uVar9];
                    auVar66 = alVar1._16_16_;
                    alVar2 = local_2b0[uVar9];
                    auVar53 = alVar2._16_16_;
                    if (iVar18 < 3) {
                      iVar19 = 0;
                      do {
                        auVar80 = vperm2i128_avx2((undefined1  [32])alVar11,
                                                  (undefined1  [32])alVar11,8);
                        alVar11 = (__m256i)vpalignr_avx2((undefined1  [32])alVar11,auVar80,8);
                        auVar69 = alVar11._16_16_;
                        auVar80 = vperm2i128_avx2((undefined1  [32])alVar12,
                                                  (undefined1  [32])alVar12,8);
                        alVar12 = (__m256i)vpalignr_avx2((undefined1  [32])alVar12,auVar80,8);
                        auVar61 = alVar12._16_16_;
                        auVar80 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,
                                                  8);
                        alVar1 = (__m256i)vpalignr_avx2((undefined1  [32])alVar1,auVar80,8);
                        auVar66 = alVar1._16_16_;
                        auVar80 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,
                                                  8);
                        alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar80,8);
                        auVar53 = alVar2._16_16_;
                        iVar19 = iVar19 + 1;
                      } while (iVar19 < iVar33);
                    }
                    uVar27 = vpextrq_avx(auVar69,1);
                    iVar91 = (int)uVar27;
                    uVar27 = vpextrq_avx(auVar61,1);
                    iVar43 = (int)uVar27;
                    uVar27 = vpextrq_avx(auVar66,1);
                    iVar28 = (int)uVar27;
                    uVar27 = vpextrq_avx(auVar53,1);
                    iVar34 = (int)uVar27;
                    uVar39 = uVar17;
                    iVar19 = iVar92;
                  }
                  auVar13._8_8_ = lVar30;
                  auVar13._0_8_ = lVar30;
                  auVar13._16_8_ = lVar30;
                  auVar13._24_8_ = lVar30;
                  auVar80 = vpcmpgtq_avx2(auVar13,auVar64);
                  auVar16._8_8_ = lVar40;
                  auVar16._0_8_ = lVar40;
                  auVar16._16_8_ = lVar40;
                  auVar16._24_8_ = lVar40;
                  auVar55 = vpcmpgtq_avx2(auVar74,auVar16);
                  auVar80 = vpor_avx2(auVar55,auVar80);
                  if ((((auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar80 >> 0x7f,0) != '\0') || SUB321(auVar80 >> 0xbf,0) != '\0') ||
                      auVar80[0x1f] < '\0') {
                    *(byte *)&ppVar20->flag = (byte)ppVar20->flag | 0x40;
                    iVar91 = 0;
                    iVar43 = 0;
                    iVar28 = 0;
                    iVar34 = 0;
                    iVar19 = 0;
                    uVar39 = 0;
                  }
                  ppVar20->score = iVar91;
                  ppVar20->end_query = uVar39;
                  ppVar20->end_ref = iVar19;
                  ((ppVar20->field_4).stats)->matches = iVar43;
                  ((ppVar20->field_4).stats)->similar = iVar28;
                  ((ppVar20->field_4).stats)->length = iVar34;
                  parasail_free(ptr_04);
                  parasail_free(b_04);
                  parasail_free(b_03);
                  parasail_free(b_02);
                  parasail_free(ptr_03);
                  parasail_free(ptr_02);
                  parasail_free(local_2b0);
                  parasail_free(ptr_01);
                  parasail_free(local_2f0);
                  parasail_free(ptr_00);
                  parasail_free(local_2e8);
                  parasail_free(ptr);
                  parasail_free(palVar31);
                  return ppVar20;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMStore = NULL;
    __m256i* restrict pvHMLoad = NULL;
    __m256i* restrict pvHSStore = NULL;
    __m256i* restrict pvHSLoad = NULL;
    __m256i* restrict pvHLStore = NULL;
    __m256i* restrict pvHLLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxHM;
    __m256i vMaxHS;
    __m256i vMaxHL;
    __m256i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m256i*)profile->profile64.score;
    vProfileM = (__m256i*)profile->profile64.matches;
    vProfileS = (__m256i*)profile->profile64.similar;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m256i(32, segLen);
    pvHLoad   = parasail_memalign___m256i(32, segLen);
    pvHMStore = parasail_memalign___m256i(32, segLen);
    pvHMLoad  = parasail_memalign___m256i(32, segLen);
    pvHSStore = parasail_memalign___m256i(32, segLen);
    pvHSLoad  = parasail_memalign___m256i(32, segLen);
    pvHLStore = parasail_memalign___m256i(32, segLen);
    pvHLLoad  = parasail_memalign___m256i(32, segLen);
    pvE       = parasail_memalign___m256i(32, segLen);
    pvEM      = parasail_memalign___m256i(32, segLen);
    pvES      = parasail_memalign___m256i(32, segLen);
    pvEL      = parasail_memalign___m256i(32, segLen);
    boundary  = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHMStore, vZero, segLen);
    parasail_memset___m256i(pvHSStore, vZero, segLen);
    parasail_memset___m256i(pvHLStore, vZero, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vH_dag;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        const __m256i* vP = NULL;
        const __m256i* vPM = NULL;
        const __m256i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vHM = _mm256_load_si256(&pvHMStore[segLen - 1]);
        vHS = _mm256_load_si256(&pvHSStore[segLen - 1]);
        vHL = _mm256_load_si256(&pvHLStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 8);
        vHM = _mm256_slli_si256_rpl(vHM, 8);
        vHS = _mm256_slli_si256_rpl(vHS, 8);
        vHL = _mm256_slli_si256_rpl(vHL, 8);

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m256i case1;
            __m256i case2;

            vE = _mm256_load_si256(pvE+ i);
            vEM = _mm256_load_si256(pvEM+ i);
            vES = _mm256_load_si256(pvES+ i);
            vEL = _mm256_load_si256(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vH = _mm256_max_epi64_rpl(vH_dag, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);

            case1 = _mm256_cmpeq_epi64(vH, vH_dag);
            case2 = _mm256_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi64(vHM, _mm256_load_si256(vPM + i)),
                    case1);
            _mm256_store_si256(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi64(vHS, _mm256_load_si256(vPS + i)),
                    case1);
            _mm256_store_si256(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm256_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vEL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvE + i, vE);
            _mm256_store_si256(pvEM + i, vEM);
            _mm256_store_si256(pvES + i, vES);
            _mm256_store_si256(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vFL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
            vHM = _mm256_load_si256(pvHMLoad + i);
            vHS = _mm256_load_si256(pvHSLoad + i);
            vHL = _mm256_load_si256(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vHp = _mm256_slli_si256_rpl(vHp, 8);
            vF = _mm256_slli_si256_rpl(vF, 8);
            vFM = _mm256_slli_si256_rpl(vFM, 8);
            vFS = _mm256_slli_si256_rpl(vFS, 8);
            vFL = _mm256_slli_si256_rpl(vFL, 8);
            vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            vFL = _mm256_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m256i case1;
                __m256i case2;
                __m256i cond;

                vHp = _mm256_add_epi64(vHp, _mm256_load_si256(vP + i));
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                case1 = _mm256_cmpeq_epi64(vH, vHp);
                case2 = _mm256_cmpeq_epi64(vH, vF);
                cond = _mm256_andnot_si256(case1, case2);

                /* calculate vM */
                vHM = _mm256_load_si256(pvHMStore + i);
                vHM = _mm256_blendv_epi8(vHM, vFM, cond);
                _mm256_store_si256(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm256_load_si256(pvHSStore + i);
                vHS = _mm256_blendv_epi8(vHS, vFS, cond);
                _mm256_store_si256(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm256_load_si256(pvHLStore + i);
                vHL = _mm256_blendv_epi8(vHL, vFL, cond);
                _mm256_store_si256(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm256_sub_epi64(vH, vGapO);
                vF_ext = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi64(vF_ext, vEF_opn),
                                _mm256_cmpeq_epi64(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
                vFM = _mm256_blendv_epi8(vFM, vHM, cond);
                vFS = _mm256_blendv_epi8(vFS, vHS, cond);
                vFL = _mm256_blendv_epi8(
                        _mm256_add_epi64(vFL, vOne),
                        _mm256_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m256i cond_max;
            vH = _mm256_load_si256(pvHStore + offset);
            vHM = _mm256_load_si256(pvHMStore + offset);
            vHS = _mm256_load_si256(pvHSStore + offset);
            vHL = _mm256_load_si256(pvHLStore + offset);
            cond_max = _mm256_cmpgt_epi64(vH, vMaxH);
            vMaxH = _mm256_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm256_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm256_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm256_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm256_movemask_epi8(_mm256_and_si256(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        result->stats->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        result->stats->rowcols->matches_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        result->stats->rowcols->similar_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        result->stats->rowcols->length_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        __m256i vHM = _mm256_load_si256(pvHMStore+i);
        __m256i vHS = _mm256_load_si256(pvHSStore+i);
        __m256i vHL = _mm256_load_si256(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
            vMaxHM = _mm256_slli_si256_rpl(vMaxHM, 8);
            vMaxHS = _mm256_slli_si256_rpl(vMaxHS, 8);
            vMaxHL = _mm256_slli_si256_rpl(vMaxHL, 8);
        }
        end_query = s1Len-1;
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl(vMaxHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl(vMaxHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl(vMaxHL, 3);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int64_t *m = (int64_t*)pvHMStore;
        int64_t *s = (int64_t*)pvHSStore;
        int64_t *l = (int64_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        __m256i vHM = _mm256_load_si256(pvHMStore + offset);
        __m256i vHS = _mm256_load_si256(pvHSStore + offset);
        __m256i vHL = _mm256_load_si256(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}